

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall
cppforth::Forth::ForthStack<unsigned_int>::push(ForthStack<unsigned_int> *this,uint x)

{
  pointer puVar1;
  uint uVar2;
  AbortException *this_00;
  
  uVar2 = this->top + 1;
  puVar1 = (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar2 <
      (ulong)((long)(this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    this->top = uVar2;
    puVar1[uVar2] = x;
    return;
  }
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  AbortException::AbortException(this_00,"Forth stack overflow");
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void push(CellType x) {
				{auto index1 = top + 1;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				stack.at(++top) = x;
			}